

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_monitor.c
# Opt level: O0

RRCrtc glfwGetX11Adapter(GLFWmonitor *handle)

{
  _GLFWmonitor *monitor;
  GLFWmonitor *handle_local;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    handle_local = (GLFWmonitor *)0x0;
  }
  else if (_glfw.platform.platformID == 0x60004) {
    handle_local = *(GLFWmonitor **)(handle + 0x128);
  }
  else {
    _glfwInputError(0x1000e,"X11: Platform not initialized");
    handle_local = (GLFWmonitor *)0x0;
  }
  return (RRCrtc)handle_local;
}

Assistant:

GLFWAPI RRCrtc glfwGetX11Adapter(GLFWmonitor* handle)
{
    _GLFWmonitor* monitor = (_GLFWmonitor*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(None);

    if (_glfw.platform.platformID != GLFW_PLATFORM_X11)
    {
        _glfwInputError(GLFW_PLATFORM_UNAVAILABLE, "X11: Platform not initialized");
        return None;
    }

    return monitor->x11.crtc;
}